

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

int main(int argc,char **argv)

{
  ctemplate_t *ctemplate;
  char *__s;
  ctemplate_functions_t methods;
  ctemplate_functions_t local_40;
  
  local_40.createMap = hash_createMap;
  local_40.destroyMap = hash_destroyMap;
  local_40.get = hash_get;
  local_40.set = hash_set;
  local_40.unset = hash_unset;
  ctemplate = ctemplate_init("/workspace/llm4binary/github/license_all_cmakelists_25/maximilianvoss[P]ctemplate/example"
                             ,(char *)0x0,&local_40,true);
  __s = ctemplate_executeTemplate(ctemplate,"template.html","{\"variable\":\"value\"}");
  puts(__s);
  free(__s);
  ctemplate_destroy(ctemplate);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	ctemplate_functions_t methods;
	methods.createMap = hash_createMap;
	methods.destroyMap = hash_destroyMap;
	methods.get = hash_get;
	methods.set = hash_set;
	methods.unset = hash_unset;

	ctemplate_t *ctemplate = ctemplate_init(EXAMPLEPATH, NULL, &methods, 1);
	char *value = ctemplate_executeTemplate(ctemplate, "template.html", "{\"variable\":\"value\"}");
	printf("%s\n", value);
	free(value);
	ctemplate_destroy(ctemplate);
	return 0;
}